

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyTest.cpp
# Opt level: O2

void __thiscall DummyTest_Copy_Test::TestBody(DummyTest_Copy_Test *this)

{
  reference piVar1;
  reference val2;
  char *pcVar2;
  AssertHelper AStack_1b8;
  AssertionResult gtest_ar;
  DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> local_1a0;
  DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> local_190;
  DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> local_180;
  DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> local_170;
  pair<Deque<int,_std::allocator<int>_>::DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_>,_Deque<int,_std::allocator<int>_>::DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_>_>
  p;
  Deque<int,_std::allocator<int>_> d2;
  Deque<int,_std::allocator<int>_> d;
  
  Deque<int,_std::allocator<int>_>::Deque(&d,(allocator<int> *)&d2);
  for (d2.current_._0_4_ = 0; (int)d2.current_._0_4_ < 100;
      d2.current_._0_4_ = d2.current_._0_4_ + 1) {
    Deque<int,_std::allocator<int>_>::push_back(&d,(value_type *)&d2);
  }
  Deque<int,_std::allocator<int>_>::Deque(&d2,&d);
  local_190.n_ = 0;
  local_190.deque_ = &d;
  local_170.n_ = Deque<int,_std::allocator<int>_>::size(&d);
  local_180.n_ = 0;
  local_180.deque_ = &d2;
  local_170.deque_ = &d;
  std::
  mismatch<Deque<int,std::allocator<int>>::DequeIterator<int,int&,int*,Deque<int,std::allocator<int>>>,Deque<int,std::allocator<int>>::DequeIterator<int,int&,int*,Deque<int,std::allocator<int>>>>
            (&p,&local_190,&local_170,&local_180);
  local_1a0.n_ = Deque<int,_std::allocator<int>_>::size(&d);
  local_1a0.deque_ = &d;
  testing::internal::
  CmpHelperEQ<Deque<int,std::allocator<int>>::DequeIterator<int,int&,int*,Deque<int,std::allocator<int>>>,Deque<int,std::allocator<int>>::DequeIterator<int,int&,int*,Deque<int,std::allocator<int>>>>
            ((internal *)&gtest_ar,"p.first","d.end()",&p.first,&local_1a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/DummyTest.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_1b8,(Message *)&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1a0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    piVar1 = Deque<int,_std::allocator<int>_>::at(&d,3);
    *piVar1 = 5;
    piVar1 = Deque<int,_std::allocator<int>_>::at(&d,3);
    val2 = Deque<int,_std::allocator<int>_>::at(&d2,3);
    testing::internal::CmpHelperNE<int,int>((internal *)&gtest_ar,"d[3]","d2[3]",piVar1,val2);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_1a0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_1b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/DummyTest.cpp"
                 ,0x25,pcVar2);
      testing::internal::AssertHelper::operator=(&AStack_1b8,(Message *)&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_1b8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1a0);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Deque<int,_std::allocator<int>_>::~Deque(&d2);
  Deque<int,_std::allocator<int>_>::~Deque(&d);
  return;
}

Assistant:

TEST(DummyTest, Copy) {
    Deque<int> d;
    for (int i = 0; i < 100; ++i) {
        d.push_back(i);
    }

    Deque<int> d2(d);
    auto p = std::mismatch(d.begin(), d.end(), d2.begin());
    ASSERT_EQ(p.first, d.end());

    d[3] = 5;
    ASSERT_NE(d[3], d2[3]);
}